

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CreateView(Parse *pParse,Token *pBegin,Token *pName1,Token *pName2,Select *pSelect,
                      int isTemp,int noErr)

{
  Table *pTVar1;
  int iVar2;
  int iVar3;
  Select *pSVar4;
  char *pcVar5;
  long *in_RSI;
  Parse *in_RDI;
  bool bVar6;
  undefined4 in_stack_00000008;
  sqlite3 *db;
  int iDb;
  Token *pName;
  DbFixer sFix;
  Token sEnd;
  char *z;
  int n;
  Table *p;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  sqlite3 *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  sqlite3 *db_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  Table *pTable;
  Parse *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  Token *in_stack_ffffffffffffffb0;
  Token *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd0;
  
  pTable = (Table *)0x0;
  db_00 = in_RDI->db;
  if (in_RDI->nVar < 1) {
    sqlite3StartTable((Parse *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                      (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8
                      ,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0);
    pTVar1 = in_RDI->pNewTable;
    if ((pTVar1 == (Table *)0x0) || (in_RDI->nErr != 0)) {
      sqlite3SelectDelete(in_stack_ffffffffffffff50,
                          (Select *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_00000008));
    }
    else {
      sqlite3TwoPartName((Parse *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (Token *)db_00,
                         (Token *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         (Token **)in_stack_ffffffffffffff50);
      iVar2 = sqlite3SchemaToIndex(db_00,pTVar1->pSchema);
      sqlite3FixInit((DbFixer *)&stack0xffffffffffffff78,in_RDI,iVar2,"view",(Token *)pTable);
      iVar3 = sqlite3FixSelect((DbFixer *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_00000008),
                               (Select *)0x167fd3);
      if (iVar3 == 0) {
        pSVar4 = sqlite3SelectDup((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffff68),
                                  (Select *)db_00,in_stack_ffffffffffffff5c);
        pTVar1->pSelect = pSVar4;
        sqlite3SelectDelete(in_stack_ffffffffffffff50,
                            (Select *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_00000008));
        if (db_00->mallocFailed == '\0') {
          if ((db_00->init).busy == '\0') {
            sqlite3ViewGetColumnNames(in_stack_ffffffffffffff78,pTable);
          }
          pcVar5 = (in_RDI->sLastToken).z;
          if ((*pcVar5 != '\0') && (*pcVar5 != ';')) {
            pcVar5 = pcVar5 + (*(ulong *)&(in_RDI->sLastToken).n & 0xffffffff);
          }
          iVar2 = (int)pcVar5 - (int)*in_RSI;
          while( true ) {
            bVar6 = false;
            if (0 < iVar2) {
              bVar6 = (""[*(byte *)(*in_RSI + (long)(iVar2 + -1))] & 1) != 0;
            }
            if (!bVar6) break;
            iVar2 = iVar2 + -1;
          }
          sqlite3EndTable((Parse *)sFix.pSchema,(Token *)sFix.pParse,pName,iDb._3_1_,(Select *)db);
        }
      }
      else {
        sqlite3SelectDelete(in_stack_ffffffffffffff50,
                            (Select *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_00000008));
      }
    }
  }
  else {
    sqlite3ErrorMsg(in_RDI,"parameters are not allowed in views");
    sqlite3SelectDelete(in_stack_ffffffffffffff50,
                        (Select *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateView(
  Parse *pParse,     /* The parsing context */
  Token *pBegin,     /* The CREATE token that begins the statement */
  Token *pName1,     /* The token that holds the name of the view */
  Token *pName2,     /* The token that holds the name of the view */
  Select *pSelect,   /* A SELECT statement that will become the new view */
  int isTemp,        /* TRUE for a TEMPORARY view */
  int noErr          /* Suppress error messages if VIEW already exists */
){
  Table *p;
  int n;
  const char *z;
  Token sEnd;
  DbFixer sFix;
  Token *pName = 0;
  int iDb;
  sqlite3 *db = pParse->db;

  if( pParse->nVar>0 ){
    sqlite3ErrorMsg(pParse, "parameters are not allowed in views");
    sqlite3SelectDelete(db, pSelect);
    return;
  }
  sqlite3StartTable(pParse, pName1, pName2, isTemp, 1, 0, noErr);
  p = pParse->pNewTable;
  if( p==0 || pParse->nErr ){
    sqlite3SelectDelete(db, pSelect);
    return;
  }
  sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  iDb = sqlite3SchemaToIndex(db, p->pSchema);
  sqlite3FixInit(&sFix, pParse, iDb, "view", pName);
  if( sqlite3FixSelect(&sFix, pSelect) ){
    sqlite3SelectDelete(db, pSelect);
    return;
  }

  /* Make a copy of the entire SELECT statement that defines the view.
  ** This will force all the Expr.token.z values to be dynamically
  ** allocated rather than point to the input string - which means that
  ** they will persist after the current sqlite3_exec() call returns.
  */
  p->pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
  sqlite3SelectDelete(db, pSelect);
  if( db->mallocFailed ){
    return;
  }
  if( !db->init.busy ){
    sqlite3ViewGetColumnNames(pParse, p);
  }

  /* Locate the end of the CREATE VIEW statement.  Make sEnd point to
  ** the end.
  */
  sEnd = pParse->sLastToken;
  if( ALWAYS(sEnd.z[0]!=0) && sEnd.z[0]!=';' ){
    sEnd.z += sEnd.n;
  }
  sEnd.n = 0;
  n = (int)(sEnd.z - pBegin->z);
  z = pBegin->z;
  while( ALWAYS(n>0) && sqlite3Isspace(z[n-1]) ){ n--; }
  sEnd.z = &z[n-1];
  sEnd.n = 1;

  /* Use sqlite3EndTable() to add the view to the SQLITE_MASTER table */
  sqlite3EndTable(pParse, 0, &sEnd, 0, 0);
  return;
}